

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O2

int gost_ec_keygen(EC_KEY *ec)

{
  bool bVar1;
  int iVar2;
  EC_GROUP *group;
  BIGNUM *order;
  BIGNUM *rnd;
  int reason;
  
  if ((ec == (EC_KEY *)0x0) || (group = EC_KEY_get0_group((EC_KEY *)ec), group == (EC_GROUP *)0x0))
  {
    ERR_GOST_error(0x6c,0xc0103,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_sign.c"
                   ,0x25e);
    return 0;
  }
  order = BN_new();
  rnd = (BIGNUM *)BN_secure_new();
  if (order == (BIGNUM *)0x0 || rnd == (BIGNUM *)0x0) {
    reason = 0xc0100;
    iVar2 = 0x265;
LAB_00122693:
    ERR_GOST_error(0x6c,reason,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_sign.c"
                   ,iVar2);
    bVar1 = true;
LAB_0012269b:
    if (rnd == (BIGNUM *)0x0) goto LAB_001226a8;
  }
  else {
    iVar2 = EC_GROUP_get_order(group,order,(BN_CTX *)0x0);
    if (iVar2 != 0) {
      do {
        iVar2 = BN_rand_range(rnd,order);
        if (iVar2 == 0) {
          reason = 0x7e;
          iVar2 = 0x270;
          goto LAB_00122693;
        }
        iVar2 = BN_is_zero(rnd);
      } while (iVar2 != 0);
      iVar2 = EC_KEY_set_private_key((EC_KEY *)ec,rnd);
      if (iVar2 == 0) {
        reason = 0xc0103;
        iVar2 = 0x277;
        goto LAB_00122693;
      }
      bVar1 = false;
      goto LAB_0012269b;
    }
    ERR_GOST_error(0x6c,0xc0103,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_sign.c"
                   ,0x26a);
    bVar1 = true;
  }
  BN_free(rnd);
LAB_001226a8:
  if (order != (BIGNUM *)0x0) {
    BN_free(order);
  }
  if (bVar1) {
    return 0;
  }
  iVar2 = gost_ec_compute_public(ec);
  return iVar2;
}

Assistant:

int gost_ec_keygen(EC_KEY *ec)
{
    BIGNUM *order = NULL, *d = NULL;
    const EC_GROUP *group = (ec) ? EC_KEY_get0_group(ec) : NULL;
    int ok = 0;

    if (!group) {
        GOSTerr(GOST_F_GOST_EC_KEYGEN, ERR_R_INTERNAL_ERROR);
        return 0;
    }

    order = BN_new();
    d = BN_secure_new();
    if (!order || !d) {
        GOSTerr(GOST_F_GOST_EC_KEYGEN, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!EC_GROUP_get_order(group, order, NULL)) {
        GOSTerr(GOST_F_GOST_EC_KEYGEN, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    do {
        if (!BN_rand_range(d, order)) {
            GOSTerr(GOST_F_GOST_EC_KEYGEN, GOST_R_RNG_ERROR);
            goto end;
        }
    }
    while (BN_is_zero(d));

    if (!EC_KEY_set_private_key(ec, d)) {
        GOSTerr(GOST_F_GOST_EC_KEYGEN, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    ok = 1;
 end:
    if (d)
        BN_free(d);
    if (order)
        BN_free(order);

    return (ok) ? gost_ec_compute_public(ec) : 0;
}